

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O3

void __thiscall
Storage::Disk::Drive::Drive
          (Drive *this,int input_clock_rate,int revolutions_per_minute,int number_of_heads,
          ReadyType rdy_type)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  int iVar4;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_005a2b90;
  (this->super_Source).observer_ = (Observer *)0x0;
  TimedEventLoop::TimedEventLoop(&this->super_TimedEventLoop,(long)input_clock_rate);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a2ae0;
  (this->super_TimedEventLoop)._vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_005a2b28
  ;
  *(undefined4 *)&this->field_0x30 = 0;
  (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->disk_).super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->has_disk_ = false;
  this->rotational_multiplier_ = 1.0;
  this->cycles_since_index_hole_ = 0;
  this->cycles_per_revolution_ = 1;
  this->head_position_ = 0;
  this->head_ = 0;
  this->available_heads_ = number_of_heads;
  this->motor_input_is_on_ = false;
  this->disk_is_rotating_ = false;
  (this->time_until_motor_transition).super_WrappedInt<Cycles>.length_ = 0;
  (this->index_pulse_remaining_).super_WrappedInt<Cycles>.length_ = 0;
  this->is_reading_ = true;
  this->clamp_writing_to_index_hole_ = false;
  (this->patched_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->patched_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->write_segment_).length_of_a_bit.length = 1;
  (this->write_segment_).length_of_a_bit.clock_rate = 1;
  (this->write_segment_).data.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->write_segment_).data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (this->write_segment_).data.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->write_segment_).data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->write_segment_).fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->write_segment_).fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->write_segment_).fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  *(uint *)((long)&(this->write_segment_).fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = 0;
  (this->write_segment_).data.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->write_segment_).fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->write_start_time_).length = 0;
  (this->write_start_time_).clock_rate = 1;
  this->ready_index_count_ = 0;
  this->ready_type_ = rdy_type;
  this->is_ready_ = false;
  (this->cycles_until_bits_written_).length = 0;
  (this->cycles_until_bits_written_).clock_rate = 1;
  (this->cycles_per_bit_).length = 0;
  (this->cycles_per_bit_).clock_rate = 1;
  this->event_delegate_ = (EventDelegate *)0x0;
  this->observer_ = (Observer *)0x0;
  (this->drive_name_)._M_dataplus._M_p = (pointer)&(this->drive_name_).field_2;
  (this->drive_name_)._M_string_length = 0;
  (this->drive_name_).field_2._M_local_buf[0] = '\0';
  this->announce_motor_led_ = false;
  set_rotation_speed(this,(float)revolutions_per_minute);
  uVar1 = std::chrono::_V2::system_clock::now();
  uVar1 = uVar1 % 0x7fffffff + (ulong)(uVar1 % 0x7fffffff == 0);
  this->random_source_ = 0;
  iVar4 = 0x40;
  uVar3 = 0;
  do {
    uVar2 = uVar1 * 0x41a7;
    uVar1 = uVar2 % 0x7fffffff;
    uVar3 = (ulong)(uVar2 % 0x7fffffff - 0x3fffffff < 0xffffffffc0000002) + uVar3 * 2;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  this->random_source_ = uVar3;
  return;
}

Assistant:

Drive::Drive(int input_clock_rate, int revolutions_per_minute, int number_of_heads, ReadyType rdy_type):
	Storage::TimedEventLoop(input_clock_rate),
	available_heads_(number_of_heads),
	ready_type_(rdy_type) {
	set_rotation_speed(revolutions_per_minute);

	const auto seed = std::default_random_engine::result_type(std::chrono::system_clock::now().time_since_epoch().count());
	std::default_random_engine randomiser(seed);

	// Get at least 64 bits of random information; rounding is likey to give this a slight bias.
	random_source_ = 0;
	auto half_range = (randomiser.max() - randomiser.min()) / 2;
	for(int bit = 0; bit < 64; ++bit) {
		random_source_ <<= 1;
		random_source_ |= ((randomiser() - randomiser.min()) >= half_range) ? 1 : 0;
	}
}